

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LUX_Run03.hh
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
DetectorExample_LUX_RUN03::FitTBA
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          DetectorExample_LUX_RUN03 *this,double xPos_mm,double yPos_mm,double zPos_mm)

{
  pointer pdVar1;
  double dVar2;
  double dVar3;
  
  pdVar1 = (pointer)operator_new(0x10);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = pdVar1;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = pdVar1 + 2;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = pdVar1 + 2;
  dVar2 = (zPos_mm / 10.0) * 0.00925 + -0.853;
  dVar3 = -1.0;
  if (-1.0 <= dVar2) {
    dVar3 = dVar2;
  }
  dVar2 = 1.0;
  if (dVar3 <= 1.0) {
    dVar2 = dVar3;
  }
  *pdVar1 = (1.0 - dVar2) * 0.5;
  pdVar1[1] = 0.449;
  return __return_storage_ptr__;
}

Assistant:

vector<double> FitTBA(double xPos_mm, double yPos_mm,
                        double zPos_mm) override {
    vector<double> BotTotRat(2);

    double radSq = (pow(xPos_mm, 2.) + pow(yPos_mm, 2.)) / 1e2;
    double TBAzS1 = -0.853 + 0.00925 * (zPos_mm / 10.);
    double TBArS2 = 0.126 + 0.000545 * radSq - 1.90e-6 * radSq * radSq +
                    1.20e-9 * radSq * radSq * radSq;

    if (TBAzS1 < -1.) TBAzS1 = -1.;
    if (TBAzS1 > 1.0) TBAzS1 = 1.0;
    if (TBArS2 < -1.) TBArS2 = -1.;
    if (TBArS2 > 1.0) TBArS2 = 1.0;

    BotTotRat[0] = (1. - TBAzS1) / 2.;  // 1712.05696
    BotTotRat[1] = 0.449;  //(1.-TBArS2)/2.;  // 1712.05696 and 1710.02752
                           // position recon (1-this)

    return BotTotRat;
  }